

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<ProString>::copyAppend
          (QGenericArrayOps<ProString> *this,ProString *b,ProString *e)

{
  ProString *pPVar1;
  long lVar2;
  
  if ((b != e) && (b < e)) {
    pPVar1 = (this->super_QArrayDataPointer<ProString>).ptr;
    lVar2 = (this->super_QArrayDataPointer<ProString>).size;
    do {
      ProString::ProString(pPVar1 + lVar2,b);
      b = b + 1;
      lVar2 = (this->super_QArrayDataPointer<ProString>).size + 1;
      (this->super_QArrayDataPointer<ProString>).size = lVar2;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }